

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplified-instance-converter.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__filename;
  FILE *fh;
  char *unaff_R14;
  Instance instance;
  
  if (argc == 3) {
    unaff_R14 = argv[1];
    __filename = argv[2];
    parse(&instance,unaff_R14);
    if ((((0 < instance.num_customers) && (0 < instance.num_vehicles)) &&
        (0.0 < instance.vehicle_cap)) && (instance.demands != (double *)0x0)) {
      fh = fopen(__filename,"w");
      if (fh != (FILE *)0x0) {
        render_instance_into_vrplib_file((FILE *)fh,&instance,true);
        instance_destroy(&instance);
        return 0;
      }
      fprintf(_stderr,"%s: failed to open file for writing\n",__filename);
      instance_destroy(&instance);
      goto LAB_001025a3;
    }
  }
  else {
    print_usage((FILE *)_stderr,*argv);
  }
  fprintf(_stderr,"%s: failed to parse\n",unaff_R14);
LAB_001025a3:
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 3) {
        print_usage(stderr, argv[0]);
        exit(EXIT_FAILURE);
    }

    char *input = argv[1];
    char *output = argv[2];

    Instance instance = parse(input);
    if (!is_valid_instance(&instance)) {
        fprintf(stderr, "%s: failed to parse\n", input);
        exit(EXIT_FAILURE);
    }

    FILE *fh = fopen(output, "w");
    if (!fh) {
        fprintf(stderr, "%s: failed to open file for writing\n", output);
        instance_destroy(&instance);
        exit(EXIT_FAILURE);
    }

    render_instance_into_vrplib_file(fh, &instance, true);
    instance_destroy(&instance);
    return EXIT_SUCCESS;
}